

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int32_t mipsdsp_sat16_mul_i16_i16(int16_t a,int16_t b,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  uint uVar2;
  undefined2 in_register_00000032;
  uint uVar3;
  undefined6 in_register_0000003a;
  
  uVar3 = (int)CONCAT62(in_register_0000003a,a) * CONCAT22(in_register_00000032,b);
  uVar2 = 0x7fff;
  if ((0x7fff < (int)uVar3) || (uVar2 = 0xffff8000, (int)uVar3 < -0x8000)) {
    uVar3 = uVar2;
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return uVar3 & 0xffff;
}

Assistant:

static inline int32_t mipsdsp_sat16_mul_i16_i16(int16_t a, int16_t b,
                                                CPUMIPSState *env)
{
    int32_t temp;

    temp = (int32_t)a * (int32_t)b;

    if (temp > (int)0x7FFF) {
        temp = 0x00007FFF;
        set_DSPControl_overflow_flag(1, 21, env);
    } else if (temp < (int)0xffff8000) {
        temp = 0xFFFF8000;
        set_DSPControl_overflow_flag(1, 21, env);
    }
    temp &= 0x0000FFFF;

    return temp;
}